

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,double number,UnicodeString *toInsertInto,int32_t pos,int32_t recursionCount
          ,UErrorCode *status)

{
  UnicodeString *src;
  short sVar1;
  NFSubstitution *pNVar2;
  uint srcLength;
  int32_t iVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  UnicodeString local_70;
  
  sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (this->fRuleText).fUnion.fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  src = &this->fRuleText;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar7 = 0;
    UnicodeString::doReplace(toInsertInto,pos,0,src,0,srcLength);
  }
  else {
    uVar8 = (int)srcLength >> 0x1f & srcLength;
    srcLength = UnicodeString::indexOf(src,L"$(",0,-1,uVar8,srcLength - uVar8);
    uVar8 = 0;
    if (-1 < (int)srcLength) {
      sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar8 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        uVar8 = (int)sVar1 >> 5;
      }
      if ((int)srcLength <= (int)uVar8) {
        uVar8 = srcLength;
      }
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar3 = UnicodeString::indexOf(src,L")$",0,-1,uVar8,iVar3 - uVar8);
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar3 < iVar7 + -1) {
      UnicodeString::tempSubString(&local_70,src,iVar3 + 2,0x7fffffff);
      uVar9 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,uVar9);
      UnicodeString::~UnicodeString(&local_70);
    }
    uVar4 = util64_pow(this->radix,this->exponent);
    auVar11._8_4_ = (int)(uVar4 >> 0x20);
    auVar11._0_8_ = uVar4;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    if ((number < 0.0) || (1.0 <= number)) {
      dVar10 = number / dVar10;
    }
    else {
      dVar10 = uprv_round_63(dVar10 * number);
    }
    PluralFormat::format(&local_70,this->rulePatternFormat,(int)dVar10,status);
    uVar9 = local_70.fUnion.fFields.fLength;
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      uVar9 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,uVar9);
    UnicodeString::~UnicodeString(&local_70);
    if (0 < (int)srcLength) {
      UnicodeString::tempSubString(&local_70,src,0,srcLength);
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,local_70.fUnion.fFields.fLength);
      UnicodeString::~UnicodeString(&local_70);
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    iVar7 = (iVar6 + iVar5) - iVar7;
  }
  pNVar2 = this->sub2;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if ((int)srcLength < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[7])
              (number,pNVar2,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  pNVar2 = this->sub1;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if ((int)srcLength < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[7])
              (number,pNVar2,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  return;
}

Assistant:

void
NFRule::doFormat(double number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto
    // [again, we have two copies of this routine that do the same thing
    // so that we don't sacrifice precision in a long by casting it
    // to a double]
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        double pluralVal = number;
        if (0 <= pluralVal && pluralVal < 1) {
            // We're in a fractional rule, and we have to match the NumeratorSubstitution behavior.
            // 2.3 can become 0.2999999999999998 for the fraction due to rounding errors.
            pluralVal = uprv_round(pluralVal * util64_pow(radix, exponent));
        }
        else {
            pluralVal = pluralVal / util64_pow(radix, exponent);
        }
        toInsertInto.insert(pos, rulePatternFormat->format((int32_t)(pluralVal), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}